

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

void __thiscall
ONX_Model::Internal_RemoveModelComponentReferenceLink
          (ONX_Model *this,ONX_ModelComponentReferenceLink *mcr_link)

{
  ONX_ModelComponentList *pOVar1;
  ONX_ModelComponentReferenceLink *pOVar2;
  ONX_ModelComponentReferenceLink *pOVar3;
  Type TVar4;
  uint uVar5;
  ON_ModelComponent *this_00;
  ulong uVar6;
  ONX_ModelComponentReferenceLink **ppOVar7;
  ONX_ModelComponentReferenceLink **ppOVar8;
  
  if (mcr_link != (ONX_ModelComponentReferenceLink *)0x0) {
    this_00 = ON_ModelComponentReference::ModelComponent(&mcr_link->m_mcr);
    if (this_00 != (ON_ModelComponent *)0x0) {
      uVar5 = ON_ModelComponent::ReferenceModelSerialNumber(this_00);
      ON_SerialNumberMap::RemoveSerialNumberAndId(&this->m_mcr_sn_map,(ulong)uVar5);
      ON_ModelComponentReference::operator=(&mcr_link->m_mcr,&ON_ModelComponentReference::Empty);
      TVar4 = ON_ModelComponent::ComponentType(this_00);
      uVar6 = 0;
      if ((int)(uint)TVar4 < (this->m_private->m_mcr_lists).m_count) {
        uVar6 = (ulong)TVar4;
      }
      pOVar1 = (this->m_private->m_mcr_lists).m_a;
      uVar5 = pOVar1[uVar6].m_count;
      if (uVar5 != 0) {
        pOVar2 = mcr_link->m_next;
        pOVar3 = mcr_link->m_prev;
        ppOVar7 = &pOVar3->m_next;
        if (pOVar3 == (ONX_ModelComponentReferenceLink *)0x0) {
          ppOVar7 = &pOVar1[uVar6].m_first_mcr_link;
        }
        ppOVar8 = &pOVar2->m_prev;
        if (pOVar2 == (ONX_ModelComponentReferenceLink *)0x0) {
          ppOVar8 = &pOVar1[uVar6].m_last_mcr_link;
        }
        *ppOVar7 = pOVar2;
        *ppOVar8 = pOVar3;
        pOVar1[uVar6].m_count = uVar5 - 1;
      }
      mcr_link->m_next = (ONX_ModelComponentReferenceLink *)0x0;
      mcr_link->m_prev = (ONX_ModelComponentReferenceLink *)0x0;
      ON_FixedSizePool::ReturnElement(&this->m_mcr_link_fsp,mcr_link);
      return;
    }
  }
  return;
}

Assistant:

void ONX_Model::Internal_RemoveModelComponentReferenceLink(
class ONX_ModelComponentReferenceLink* mcr_link
  )
{
  if (nullptr == mcr_link)
    return;

  const ON_ModelComponent* model_component = mcr_link->m_mcr.ModelComponent();

  if ( nullptr == model_component )
    return;

  m_mcr_sn_map.RemoveSerialNumberAndId(model_component->ReferenceModelSerialNumber());

  mcr_link->m_mcr = ON_ModelComponentReference::Empty;

  ONX_Model::ONX_ModelComponentList& list = Internal_ComponentList(model_component->ComponentType());
  if (list.m_count > 0)
  {
    if (mcr_link->m_prev)
      mcr_link->m_prev->m_next = mcr_link->m_next;
    else
      list.m_first_mcr_link = mcr_link->m_next;
    if (mcr_link->m_next)
      mcr_link->m_next->m_prev = mcr_link->m_prev;
    else
      list.m_last_mcr_link = mcr_link->m_prev;
    list.m_count--;
  }

  mcr_link->m_prev = nullptr;
  mcr_link->m_next = nullptr;

  m_mcr_link_fsp.ReturnElement(mcr_link);
}